

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_container_grow(array_container_t *container,int32_t min,_Bool preserve)

{
  int32_t val;
  int32_t iVar1;
  void *pvVar2;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  uint16_t *array;
  int32_t new_capacity;
  int32_t max;
  size_t in_stack_ffffffffffffffd8;
  
  iVar1 = 0x10000;
  if (in_ESI < 0x1001) {
    iVar1 = 0x1000;
  }
  val = grow_capacity(*(int32_t *)(in_RDI + 4));
  iVar1 = clamp(val,in_ESI,iVar1);
  *(int32_t *)(in_RDI + 4) = iVar1;
  if ((in_DL & 1) == 0) {
    if (*(void **)(in_RDI + 8) != (void *)0x0) {
      roaring_free((void *)0x111ea9);
    }
    pvVar2 = roaring_malloc(0x111eb6);
    *(void **)(in_RDI + 8) = pvVar2;
  }
  else {
    pvVar2 = roaring_realloc(*(void **)(in_RDI + 8),in_stack_ffffffffffffffd8);
    *(void **)(in_RDI + 8) = pvVar2;
    if (*(long *)(in_RDI + 8) == 0) {
      roaring_free((void *)0x111e95);
    }
  }
  return;
}

Assistant:

void array_container_grow(array_container_t *container, int32_t min,
                          bool preserve) {
    int32_t max = (min <= DEFAULT_MAX_SIZE ? DEFAULT_MAX_SIZE : 65536);
    int32_t new_capacity = clamp(grow_capacity(container->capacity), min, max);

    container->capacity = new_capacity;
    uint16_t *array = container->array;

    if (preserve) {
        container->array =
            (uint16_t *)roaring_realloc(array, new_capacity * sizeof(uint16_t));
        if (container->array == NULL) roaring_free(array);
    } else {
        // Jon Strabala reports that some tools complain otherwise
        if (array != NULL) {
            roaring_free(array);
        }
        container->array =
            (uint16_t *)roaring_malloc(new_capacity * sizeof(uint16_t));
    }

    // if realloc fails, we have container->array == NULL.
}